

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O2

void penguinV::GammaCorrection
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double a,double gamma)

{
  bool bVar1;
  ImageTypeManager *this;
  FunctionTableHolder *pFVar2;
  imageException *this_00;
  GammaCorrectionForm4 p_Var3;
  uint8_t uVar4;
  ImageTypeManager *pIVar5;
  allocator local_147;
  allocator local_146;
  allocator local_145;
  uint32_t local_144;
  uint32_t local_140;
  uint32_t local_13c;
  Image *local_138;
  double local_130;
  double local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  ImageManager manager;
  
  local_144 = startYIn;
  local_140 = startXOut;
  local_13c = startYOut;
  local_138 = out;
  local_130 = a;
  local_128 = gamma;
  this = ImageTypeManager::instance();
  pFVar2 = ImageTypeManager::functionTable(this,in->_type);
  p_Var3 = pFVar2->GammaCorrection;
  uVar4 = in->_type;
  if (p_Var3 == (GammaCorrectionForm4)0x0) {
    bVar1 = ImageTypeManager::isIntertypeConversionEnabled(this);
    if (bVar1) {
      ImageTypeManager::imageTypes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&manager,this);
      for (pIVar5 = manager._registrator;
          pIVar5 != (ImageTypeManager *)
                    manager._input.
                    super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pIVar5 = (ImageTypeManager *)&(pIVar5->_functionTableMap)._M_t._M_impl.field_0x1) {
        pFVar2 = ImageTypeManager::functionTable
                           (this,*(uint8_t *)&(pIVar5->_functionTableMap)._M_t._M_impl);
        p_Var3 = pFVar2->GammaCorrection;
        if (p_Var3 != (GammaCorrectionForm4)0x0) {
          uVar4 = *(uint8_t *)&(pIVar5->_functionTableMap)._M_t._M_impl;
          goto LAB_00119f40;
        }
      }
      p_Var3 = (GammaCorrectionForm4)0x0;
LAB_00119f40:
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&manager);
      if (p_Var3 != (GammaCorrectionForm4)0x0) goto LAB_00119f56;
    }
    std::__cxx11::string::string((string *)&local_e0,"Function ",&local_145);
    std::__cxx11::string::string((string *)&local_100,"GammaCorrection",&local_146);
    std::operator+(&local_c0,&local_e0,&local_100);
    std::__cxx11::string::string((string *)&local_120," is not defined",&local_147);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&manager,
                   &local_c0,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = (imageException *)__cxa_allocate_exception(0x28);
    imageException::imageException(this_00,(char *)manager._registrator);
    __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
  }
LAB_00119f56:
  manager._registrator = ImageTypeManager::instance();
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._input.
  super__Vector_base<(anonymous_namespace)::ConstReferenceOwner_*,_std::allocator<(anonymous_namespace)::ConstReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._output.
  super__Vector_base<(anonymous_namespace)::ReferenceOwner_*,_std::allocator<(anonymous_namespace)::ReferenceOwner_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._inputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  manager._outputClone.
  super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manager._type = uVar4;
  (*p_Var3)(in,startXIn,local_144,local_138,local_140,local_13c,width,height,local_130,local_128);
  anon_unknown.dwarf_a4e46::ImageManager::~ImageManager(&manager);
  return;
}

Assistant:

void GammaCorrection( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                          uint32_t width, uint32_t height, double a, double gamma )
    {
        initialize( in, GammaCorrection )
        func( in, startXIn, startYIn, out, startXOut, startYOut, width, height, a, gamma );
    }